

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DLM.cpp
# Opt level: O0

void __thiscall OpenMD::DLM::doRotate(DLM *this,StuntDouble *sd,Vector3d *ji,RealType dt)

{
  uint i_00;
  uint i_01;
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  Vector<double,_3U> *in_RDX;
  StuntDouble *in_RSI;
  undefined8 in_RDI;
  RotMat3x3d *in_XMM0_Qa;
  DLM *unaff_retaddr;
  int k;
  int j;
  int i;
  Mat3x3d I;
  RotMat3x3d A;
  RealType angle;
  RealType dt2;
  StuntDouble *in_stack_fffffffffffffe28;
  double dVar5;
  RectMatrix<double,_3U,_3U> local_c0;
  undefined1 local_78 [72];
  double local_30;
  double local_28;
  RotMat3x3d *pRVar6;
  
  local_28 = (double)in_XMM0_Qa * 0.5;
  StuntDouble::getA(in_stack_fffffffffffffe28);
  (*in_RSI->_vptr_StuntDouble[5])(&local_c0);
  bVar2 = StuntDouble::isLinear(in_RSI);
  dVar1 = local_28;
  if (bVar2) {
    iVar3 = StuntDouble::linearAxis(in_RSI);
    dVar5 = local_28;
    i_00 = iVar3 + 1 + ((iVar3 + 1) / 3) * -3;
    i_01 = iVar3 + 2 + ((iVar3 + 2) / 3) * -3;
    pdVar4 = Vector<double,_3U>::operator[](in_RDX,i_00);
    dVar1 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,i_00,i_00);
    local_30 = (dVar5 * dVar1) / *pdVar4;
    rotateStep(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(RealType)in_RSI,
               (Vector3d *)in_RDX,in_XMM0_Qa);
    pRVar6 = in_XMM0_Qa;
    pdVar4 = Vector<double,_3U>::operator[](in_RDX,i_01);
    dVar1 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,i_01,i_01);
    local_30 = ((double)in_XMM0_Qa * dVar1) / *pdVar4;
    rotateStep(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(RealType)in_RSI,
               (Vector3d *)in_RDX,pRVar6);
    dVar5 = local_28;
    pdVar4 = Vector<double,_3U>::operator[](in_RDX,i_00);
    dVar1 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,i_00,i_00);
    local_30 = (dVar5 * dVar1) / *pdVar4;
    rotateStep(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(RealType)in_RSI,
               (Vector3d *)in_RDX,pRVar6);
  }
  else {
    pdVar4 = Vector<double,_3U>::operator[](in_RDX,0);
    dVar5 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,0,0);
    local_30 = (dVar1 * dVar5) / *pdVar4;
    rotateStep(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(RealType)in_RSI,
               (Vector3d *)in_RDX,in_XMM0_Qa);
    dVar5 = local_28;
    pdVar4 = Vector<double,_3U>::operator[](in_RDX,1);
    dVar1 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,1,1);
    local_30 = (dVar5 * dVar1) / *pdVar4;
    rotateStep(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(RealType)in_RSI,
               (Vector3d *)in_RDX,in_XMM0_Qa);
    pRVar6 = in_XMM0_Qa;
    pdVar4 = Vector<double,_3U>::operator[](in_RDX,2);
    dVar1 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,2,2);
    local_30 = ((double)in_XMM0_Qa * dVar1) / *pdVar4;
    rotateStep(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(RealType)in_RSI,
               (Vector3d *)in_RDX,pRVar6);
    dVar5 = local_28;
    pdVar4 = Vector<double,_3U>::operator[](in_RDX,1);
    dVar1 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,1,1);
    local_30 = (dVar5 * dVar1) / *pdVar4;
    rotateStep(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(RealType)in_RSI,
               (Vector3d *)in_RDX,pRVar6);
    dVar5 = local_28;
    pdVar4 = Vector<double,_3U>::operator[](in_RDX,0);
    dVar1 = *pdVar4;
    pdVar4 = RectMatrix<double,_3U,_3U>::operator()(&local_c0,0,0);
    local_30 = (dVar5 * dVar1) / *pdVar4;
    rotateStep(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(RealType)in_RSI,
               (Vector3d *)in_RDX,pRVar6);
  }
  (*in_RSI->_vptr_StuntDouble[3])(in_RSI,local_78);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd3e0);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3bd3ed);
  return;
}

Assistant:

void DLM::doRotate(StuntDouble* sd, Vector3d& ji, RealType dt) {
    RealType dt2 = 0.5 * dt;
    RealType angle;

    RotMat3x3d A = sd->getA();
    Mat3x3d I    = sd->getI();

    // use the angular velocities to propagate the rotation matrix a full time
    // step
    if (sd->isLinear()) {
      int i = sd->linearAxis();
      int j = (i + 1) % 3;
      int k = (i + 2) % 3;

      angle = dt2 * ji[j] / I(j, j);
      rotateStep(k, i, angle, ji, A);

      angle = dt * ji[k] / I(k, k);
      rotateStep(i, j, angle, ji, A);

      angle = dt2 * ji[j] / I(j, j);
      rotateStep(k, i, angle, ji, A);

    } else {
      // rotate about the x-axis
      angle = dt2 * ji[0] / I(0, 0);
      rotateStep(1, 2, angle, ji, A);

      // rotate about the y-axis
      angle = dt2 * ji[1] / I(1, 1);
      rotateStep(2, 0, angle, ji, A);

      // rotate about the z-axis
      angle = dt * ji[2] / I(2, 2);
      rotateStep(0, 1, angle, ji, A);

      // rotate about the y-axis
      angle = dt2 * ji[1] / I(1, 1);
      rotateStep(2, 0, angle, ji, A);

      // rotate about the x-axis
      angle = dt2 * ji[0] / I(0, 0);
      rotateStep(1, 2, angle, ji, A);
    }

    sd->setA(A);
  }